

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setChildPtrmaps(MemPage *pPage)

{
  u8 uVar1;
  u8 uVar2;
  u8 uVar3;
  ushort uVar4;
  Pgno parent;
  BtShared *pBt_00;
  u8 *puVar5;
  u32 uVar6;
  Pgno childPgno_1;
  Pgno childPgno;
  u8 *pCell;
  Pgno pgno;
  u8 isInitOrig;
  BtShared *pBt;
  uint local_18;
  int rc;
  int nCell;
  int i;
  MemPage *pPage_local;
  
  pBt_00 = pPage->pBt;
  uVar1 = pPage->isInit;
  parent = pPage->pgno;
  _nCell = pPage;
  pBt._4_4_ = btreeInitPage(pPage);
  if (pBt._4_4_ == 0) {
    local_18 = (uint)_nCell->nCell;
    for (rc = 0; rc < (int)local_18; rc = rc + 1) {
      puVar5 = _nCell->aData;
      uVar4 = _nCell->maskPage;
      uVar2 = _nCell->aCellIdx[rc << 1];
      uVar3 = _nCell->aCellIdx[(long)(rc << 1) + 1];
      ptrmapPutOvflPtr(_nCell,puVar5 + (int)(uint)(uVar4 & CONCAT11(uVar2,uVar3)),
                       (int *)((long)&pBt + 4));
      if (_nCell->leaf == '\0') {
        uVar6 = sqlite3Get4byte(puVar5 + (int)(uint)(uVar4 & CONCAT11(uVar2,uVar3)));
        ptrmapPut(pBt_00,uVar6,'\x05',parent,(int *)((long)&pBt + 4));
      }
    }
    if (_nCell->leaf == '\0') {
      uVar6 = sqlite3Get4byte(_nCell->aData + (int)(_nCell->hdrOffset + 8));
      ptrmapPut(pBt_00,uVar6,'\x05',parent,(int *)((long)&pBt + 4));
    }
  }
  _nCell->isInit = uVar1;
  return pBt._4_4_;
}

Assistant:

static int setChildPtrmaps(MemPage *pPage){
  int i;                             /* Counter variable */
  int nCell;                         /* Number of cells in page pPage */
  int rc;                            /* Return code */
  BtShared *pBt = pPage->pBt;
  u8 isInitOrig = pPage->isInit;
  Pgno pgno = pPage->pgno;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  rc = btreeInitPage(pPage);
  if( rc!=SQLITE_OK ){
    goto set_child_ptrmaps_out;
  }
  nCell = pPage->nCell;

  for(i=0; i<nCell; i++){
    u8 *pCell = findCell(pPage, i);

    ptrmapPutOvflPtr(pPage, pCell, &rc);

    if( !pPage->leaf ){
      Pgno childPgno = get4byte(pCell);
      ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
    }
  }

  if( !pPage->leaf ){
    Pgno childPgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
  }

set_child_ptrmaps_out:
  pPage->isInit = isInitOrig;
  return rc;
}